

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallprimes.c
# Opt level: O1

void init_smallprimes(void)

{
  size_t i;
  ulong uVar1;
  size_t j;
  ulong uVar2;
  long lVar3;
  _Bool A [65536];
  char acStack_10008 [65544];
  
  if (smallprimes_array[0] == 0) {
    memset(acStack_10008 + 2,1,0xfffe);
    uVar1 = 2;
    do {
      if ((uVar1 < 0x8000) && (acStack_10008[uVar1] != '\0')) {
        uVar2 = uVar1 * 2;
        do {
          acStack_10008[uVar2] = '\0';
          uVar2 = uVar2 + uVar1;
        } while (uVar2 < 0x10000);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x10000);
    lVar3 = 2;
    uVar1 = 0;
    do {
      if (acStack_10008[lVar3] == '\x01') {
        if (0x198d < uVar1) {
          __assert_fail("pos < NSMALLPRIMES",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                        ,0x26,"void init_smallprimes(void)");
        }
        smallprimes_array[uVar1] = (unsigned_short)lVar3;
        uVar1 = uVar1 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10000);
    if (uVar1 != 0x198e) {
      __assert_fail("pos == NSMALLPRIMES",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                    ,0x2b,"void init_smallprimes(void)");
    }
  }
  return;
}

Assistant:

void init_smallprimes(void)
{
    if (smallprimes_array[0])
        return;                        /* already done */

    bool A[65536];

    for (size_t i = 2; i < lenof(A); i++)
        A[i] = true;

    for (size_t i = 2; i < lenof(A); i++) {
        if (!A[i])
            continue;
        for (size_t j = 2*i; j < lenof(A); j += i)
            A[j] = false;
    }

    size_t pos = 0;
    for (size_t i = 2; i < lenof(A); i++) {
        if (A[i]) {
            assert(pos < NSMALLPRIMES);
            smallprimes_array[pos++] = i;
        }
    }

    assert(pos == NSMALLPRIMES);
}